

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O1

ostream * sciplot::internal::
          write<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
                    (ostream *out,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,vector<double,_std::allocator<double>_> *args_1)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  
  uVar1 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  uVar2 = (long)(args_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(args_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar1 <= uVar2) {
    uVar2 = uVar1;
  }
  if (uVar2 != 0) {
    i = 0;
    do {
      writeline<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
                (out,i,args,args_1);
      i = i + 1;
    } while (uVar2 != i);
  }
  return out;
}

Assistant:

auto write(std::ostream& out, const Args&... args) -> std::ostream&
{
    const auto size = minsize(args...);
    for (std::size_t i = 0; i < size; ++i)
        writeline(out, i, args...);
    return out;
}